

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  long *plVar1;
  long *plVar2;
  Size *pSVar3;
  int _imgWidth;
  int _imgHeight;
  string imagePath;
  string exportPath;
  CTables tables;
  Mat cvImage;
  CHog hog;
  Mat visualMat;
  long *local_288;
  long lStack_280;
  long local_278;
  long lStack_270;
  undefined1 *local_268;
  undefined8 local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  _InputArray local_228;
  long lStack_210;
  long *local_208 [2];
  long local_1f8 [2];
  int local_1e8;
  int local_1e4;
  CTables local_1e0;
  uint local_198 [2];
  uint local_190;
  uint local_18c;
  uchar *local_188;
  CHog local_138;
  CHog local_f0;
  Mat local_90 [96];
  
  local_268 = &local_258;
  local_260 = 0;
  local_258 = 0;
  local_248 = &local_238;
  local_240 = 0;
  local_238 = 0;
  if (argc == 2) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_268,0,(char *)0x0,(ulong)__s);
    CTables::CTables(&local_1e0,NUM_ORI_HALF,NUM_ORI_FULL,CELL_SIZE,true);
    local_138.hist = (histCell **)0x0;
    local_138.dx = (int **)0x0;
    local_138.dy = (int **)0x0;
    cv::imread((string *)local_198,(int)&local_268);
    if (local_188 != (uchar *)0x0) {
      _imgWidth = local_18c - (int)local_18c % CELL_SIZE;
      _imgHeight = local_190 - (int)local_190 % CELL_SIZE;
      CHog::initialHist(&local_138,_imgWidth,_imgHeight,(local_198[0] >> 3 & 0x1ff) + 1,NUM_ORI_HALF
                        ,NUM_ORI_FULL,CELL_SIZE);
      local_f0.dy = (int **)0x0;
      local_f0.hist._0_4_ = 0x1010000;
      local_228.sz.width = 0;
      local_228.sz.height = 0;
      local_228.flags = 0x2010000;
      local_228.obj = (string *)local_198;
      local_1e8 = _imgWidth;
      local_1e4 = _imgHeight;
      local_f0.dx = (int **)local_198;
      cv::resize(0,0);
      printf("width:%d, height:%d\n",(ulong)local_18c,(ulong)local_190);
      CHog::calcDiff(&local_138,local_188,local_1e0.magnitudeTable);
      CHog::calcHist(&local_138,local_1e0.orientationFullTable,local_1e0.orientationHalfTable,
                     local_1e0.interpolationTableInt,local_1e0.weightedBinTable);
      cv::Mat::Mat(local_90);
      CHog::visualizationFull(&local_f0,(Mat *)&local_138);
      cv::Mat::~Mat(local_90);
      std::__cxx11::string::rfind((char *)&local_268,0x1081bf,0xffffffffffffffff);
      std::__cxx11::string::rfind((char *)&local_268,0x1081c1,0xffffffffffffffff);
      std::__cxx11::string::rfind((char *)&local_268,0x1081bf,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)local_208,(ulong)&local_268);
      plVar1 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x1081be);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_278 = *plVar2;
        lStack_270 = plVar1[3];
        local_288 = &local_278;
      }
      else {
        local_278 = *plVar2;
        local_288 = (long *)*plVar1;
      }
      lStack_280 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_288);
      pSVar3 = (Size *)(plVar1 + 2);
      if ((Size *)*plVar1 == pSVar3) {
        local_228.sz = *pSVar3;
        lStack_210 = plVar1[3];
        local_228._0_8_ = &local_228.sz;
      }
      else {
        local_228.sz = *pSVar3;
        local_228._0_8_ = (Size *)*plVar1;
      }
      local_228.obj = (void *)plVar1[1];
      *plVar1 = (long)pSVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_248,(string *)&local_228);
      if ((Size *)local_228._0_8_ != &local_228.sz) {
        operator_delete((void *)local_228._0_8_,(ulong)((long)local_228.sz + 1));
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      local_228.sz.width = 0;
      local_228.sz.height = 0;
      local_228.flags = 0x1010000;
      local_228.obj = &local_f0;
      local_278 = 0;
      local_288 = (long *)0x0;
      lStack_280 = 0;
      cv::imwrite((string *)&local_248,&local_228,(vector *)&local_288);
      if (local_288 != (long *)0x0) {
        operator_delete(local_288,local_278 - (long)local_288);
      }
      cv::Mat::~Mat((Mat *)&local_f0);
      cv::Mat::~Mat((Mat *)local_198);
      CHog::releaseHist(&local_138);
      CHog::releaseDiff(&local_138);
      CTables::~CTables(&local_1e0);
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
      }
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no such image: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"imagePath",9);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wrong input",0xb);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
	string imagePath;
	string exportPath;
	if(argc==2)
	{
		imagePath = argv[1];
	}
	else
	{
		cout<<"wrong input"<<endl;
		exit(0);
	}
	CTables tables(NUM_ORI_HALF, NUM_ORI_FULL, CELL_SIZE, true);  //建立Look Up Table
	CHog hog;

	cv::Mat cvImage = cv::imread(imagePath);
	if (cvImage.data == NULL)
	{
		cout << "no such image: " << "imagePath" << endl;
		exit(0);
	}
	int width = cvImage.cols/CELL_SIZE*CELL_SIZE;
	int height = cvImage.rows/CELL_SIZE*CELL_SIZE;
	hog.initialHist(width,
			height,
			cvImage.channels(),
			NUM_ORI_HALF,
			NUM_ORI_FULL,
			CELL_SIZE);  //初始化一幅图像的HOG直方图
	cv::resize(cvImage, cvImage, cv::Size(width, height));  //将图像尺寸调整到cell尺寸的整倍数
	printf("width:%d, height:%d\n", cvImage.cols, cvImage.rows);
	unsigned char* image = cvImage.ptr();  //将图像数据传给指针，不知道去除opencv的数据类型是否有助于提升速度

	hog.calcDiff(image, tables.magnitudeTable);
	hog.calcHist(tables.orientationFullTable,
			tables.orientationHalfTable,
			tables.interpolationTableInt,
			tables.weightedBinTable);  //计算HOG直方图

	cv::Mat visualMat = hog.visualizationFull();
	//cv::imshow("hog mat", visualMat);
	//cv::waitKey(0);
	exportPath = "./" + imagePath.substr(imagePath.rfind("/")+1, imagePath.rfind(".") - imagePath.rfind("/") - 1) + "_hog.png";
	cv::imwrite(exportPath, visualMat);
	return 0;
}